

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::ViewportCallOrderCase::verifyImage
          (ViewportCallOrderCase *this,PixelBufferAccess *result)

{
  byte bVar1;
  int iVar2;
  deInt32 dVar3;
  deInt32 dVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  TestLog *pTVar8;
  MessageBuilder *this_00;
  bool local_4c9;
  bool local_4bd;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  LogImage local_430;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  LogImage local_350;
  allocator<char> local_2b9;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  LogImageSet local_270;
  MessageBuilder local_230;
  deUint32 local_b0;
  bool local_aa;
  bool local_a9;
  undefined1 local_a8 [6];
  bool outsideMeshArea;
  bool insideMeshArea;
  IVec4 pixel;
  int x;
  int y;
  PixelBufferAccess local_70;
  byte local_41;
  undefined1 local_40 [7];
  bool anyError;
  Surface errorMask;
  IVec2 outsideBorder;
  IVec2 insideBorder;
  PixelBufferAccess *result_local;
  ViewportCallOrderCase *this_local;
  
  iVar2 = tcu::ConstPixelBufferAccess::getWidth(&result->super_ConstPixelBufferAccess);
  dVar3 = deCeilFloatToInt32((float)iVar2 * 0.25);
  iVar2 = tcu::ConstPixelBufferAccess::getWidth(&result->super_ConstPixelBufferAccess);
  dVar4 = deFloorFloatToInt32((float)iVar2 * 0.5);
  tcu::Vector<int,_2>::Vector(&outsideBorder,dVar3 + 1,dVar4 + -1);
  iVar2 = tcu::ConstPixelBufferAccess::getWidth(&result->super_ConstPixelBufferAccess);
  dVar3 = deFloorFloatToInt32((float)iVar2 * 0.25);
  iVar2 = tcu::ConstPixelBufferAccess::getWidth(&result->super_ConstPixelBufferAccess);
  dVar4 = deCeilFloatToInt32((float)iVar2 * 0.5);
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&errorMask.m_pixels.m_cap,dVar3 + -1,dVar4 + 1);
  iVar2 = tcu::ConstPixelBufferAccess::getWidth(&result->super_ConstPixelBufferAccess);
  iVar5 = tcu::ConstPixelBufferAccess::getHeight(&result->super_ConstPixelBufferAccess);
  tcu::Surface::Surface((Surface *)local_40,iVar2,iVar5);
  local_41 = 0;
  tcu::Surface::getAccess(&local_70,(Surface *)local_40);
  tcu::RGBA::green();
  tcu::RGBA::toIVec((RGBA *)&y);
  tcu::clear(&local_70,(IVec4 *)&y);
  pixel.m_data[3] = 0;
  do {
    iVar2 = pixel.m_data[3];
    iVar5 = tcu::ConstPixelBufferAccess::getHeight(&result->super_ConstPixelBufferAccess);
    if (iVar5 <= iVar2) {
      if ((local_41 & 1) != 0) {
        pTVar8 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_230,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
        this_00 = tcu::MessageBuilder::operator<<
                            (&local_230,(char (*) [27])"Image verification failed.");
        pTVar8 = tcu::MessageBuilder::operator<<
                           (this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"Images",&local_291)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2b8,"Image verification",&local_2b9);
        tcu::LogImageSet::LogImageSet(&local_270,&local_290,&local_2b8);
        pTVar8 = tcu::TestLog::operator<<(pTVar8,&local_270);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_370,"ResultImage",&local_371);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_398,"Result image",&local_399);
        tcu::LogImage::LogImage
                  (&local_350,&local_370,&local_398,&result->super_ConstPixelBufferAccess,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar8 = tcu::TestLog::operator<<(pTVar8,&local_350);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_450,"ErrorMask",&local_451);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_478,"Error mask",&local_479);
        tcu::LogImage::LogImage
                  (&local_430,&local_450,&local_478,(Surface *)local_40,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar8 = tcu::TestLog::operator<<(pTVar8,&local_430);
        tcu::TestLog::operator<<(pTVar8,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
        tcu::LogImage::~LogImage(&local_430);
        std::__cxx11::string::~string((string *)&local_478);
        std::allocator<char>::~allocator(&local_479);
        std::__cxx11::string::~string((string *)&local_450);
        std::allocator<char>::~allocator(&local_451);
        tcu::LogImage::~LogImage(&local_350);
        std::__cxx11::string::~string((string *)&local_398);
        std::allocator<char>::~allocator(&local_399);
        std::__cxx11::string::~string((string *)&local_370);
        std::allocator<char>::~allocator(&local_371);
        tcu::LogImageSet::~LogImageSet(&local_270);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::allocator<char>::~allocator(&local_2b9);
        std::__cxx11::string::~string((string *)&local_290);
        std::allocator<char>::~allocator(&local_291);
        tcu::MessageBuilder::~MessageBuilder(&local_230);
      }
      bVar1 = local_41 ^ 0xff;
      tcu::Surface::~Surface((Surface *)local_40);
      return (bool)(bVar1 & 1);
    }
    pixel.m_data[2] = 0;
    while( true ) {
      iVar2 = pixel.m_data[2];
      iVar5 = tcu::ConstPixelBufferAccess::getWidth(&result->super_ConstPixelBufferAccess);
      if (iVar5 <= iVar2) break;
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)local_a8,(int)result,pixel.m_data[2],pixel.m_data[3]);
      iVar2 = pixel.m_data[2];
      iVar6 = tcu::Vector<int,_2>::x(&outsideBorder);
      iVar5 = pixel.m_data[2];
      local_4bd = false;
      if (iVar6 <= iVar2) {
        iVar2 = tcu::Vector<int,_2>::x(&outsideBorder);
        local_4bd = iVar5 <= iVar2;
      }
      iVar2 = pixel.m_data[2];
      local_a9 = local_4bd;
      iVar6 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&errorMask.m_pixels.m_cap);
      iVar5 = pixel.m_data[2];
      local_4c9 = false;
      if (iVar2 <= iVar6) {
        iVar2 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&errorMask.m_pixels.m_cap);
        local_4c9 = iVar2 <= iVar5;
      }
      local_aa = local_4c9;
      if ((local_a9 & 1U) == 0) {
LAB_009e90af:
        if ((local_aa & 1U) != 0) {
          piVar7 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_a8,0);
          if (*piVar7 == 0) {
            piVar7 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_a8,1);
            if (*piVar7 == 0) {
              piVar7 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_a8,2);
              if (*piVar7 == 0) goto LAB_009e9160;
            }
          }
          goto LAB_009e90fb;
        }
      }
      else {
        piVar7 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_a8,1);
        if (*piVar7 == 0xff) {
          piVar7 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_a8,2);
          if (*piVar7 == 0) goto LAB_009e90af;
        }
LAB_009e90fb:
        iVar5 = pixel.m_data[3];
        iVar2 = pixel.m_data[2];
        local_b0 = (deUint32)tcu::RGBA::red();
        tcu::Surface::setPixel((Surface *)local_40,iVar2,iVar5,(RGBA)local_b0);
        local_41 = 1;
      }
LAB_009e9160:
      pixel.m_data[2] = pixel.m_data[2] + 1;
    }
    pixel.m_data[3] = pixel.m_data[3] + 1;
  } while( true );
}

Assistant:

bool ViewportCallOrderCase::verifyImage (const tcu::PixelBufferAccess& result)
{
	const tcu::IVec2	insideBorder	(deCeilFloatToInt32(0.25f * (float)result.getWidth()) + 1, deFloorFloatToInt32(0.5f * (float)result.getWidth()) - 1);
	const tcu::IVec2	outsideBorder	(deFloorFloatToInt32(0.25f * (float)result.getWidth()) - 1, deCeilFloatToInt32(0.5f * (float)result.getWidth()) + 1);
	tcu::Surface		errorMask		(result.getWidth(), result.getHeight());
	bool				anyError		= false;

	tcu::clear(errorMask.getAccess(), tcu::RGBA::green().toIVec());

	for (int y = 0; y < result.getHeight(); ++y)
	for (int x = 0; x < result.getWidth(); ++x)
	{
		const tcu::IVec4	pixel			= result.getPixelInt(x, y);
		const bool			insideMeshArea	= x >= insideBorder.x() && x <= insideBorder.x();
		const bool			outsideMeshArea = x <= outsideBorder.x() && x >= outsideBorder.x();

		// inside mesh, allow green, yellow and any shade between
		// outside mesh, allow background (black) only
		// in the border area, allow anything
		if ((insideMeshArea && (pixel[1] != 255 || pixel[2] != 0)) ||
			(outsideMeshArea && (pixel[0] != 0 || pixel[1] != 0 || pixel[2] != 0)))
		{
			errorMask.setPixel(x, y, tcu::RGBA::red());
			anyError = true;
		}
	}

	if (anyError)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Image verification failed."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Images", "Image verification")
			<< tcu::TestLog::Image("ResultImage", "Result image", result)
			<< tcu::TestLog::Image("ErrorMask", "Error mask", errorMask)
			<< tcu::TestLog::EndImageSet;
	}

	return !anyError;
}